

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O1

void __thiscall wasm::OptimizeAddedConstants::findPropagatable(OptimizeAddedConstants *this)

{
  Expression **ppEVar1;
  Expression *pEVar2;
  _Hash_node_base _Var3;
  _Hash_node_base *p_Var4;
  Locations *pLVar5;
  _Base_ptr p_Var6;
  SetInfluences *pSVar7;
  Expression *pEVar8;
  long lVar9;
  __node_base *p_Var10;
  __hash_code __code;
  pointer pTVar11;
  LocalSet *pLVar12;
  Expression *pEVar13;
  _Rb_tree_header *p_Var14;
  undefined1 auStack_1c8 [8];
  GetParents parents;
  LocalSet *local_40;
  LocalSet *set;
  
  local_40 = (LocalSet *)
             ((this->
              super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
              ).
              super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
              .
              super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
             .currFunction)->body;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&parents.inner.parentMap._M_h._M_rehash_policy._M_next_resize;
  auStack_1c8 = (undefined1  [8])0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .replacep = (Expression **)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.fixed._M_elems[9] = (Expression *)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .currFunction = (Function *)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .currModule = (Module *)0x0;
  parents.inner.parentMap._M_h._M_buckets = (__buckets_ptr)0x1;
  parents.inner.parentMap._M_h._M_bucket_count = 0;
  parents.inner.parentMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  parents.inner.parentMap._M_h._M_element_count._0_4_ = 0x3f800000;
  parents.inner.parentMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  parents.inner.parentMap._M_h._M_rehash_policy._4_4_ = 0;
  parents.inner.parentMap._M_h._M_rehash_policy._M_next_resize = 0;
  set = (LocalSet *)this;
  Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
              *)auStack_1c8,
             ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             ::scan,(Expression **)&local_40);
  if (((long)parents.inner.
             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)parents.inner.
             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)parents.inner.
            super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .replacep != 0) {
    do {
      if ((pointer)parents.inner.
                   super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          parents.inner.
          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (parents.inner.
            super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::Task, N = 10]"
                       );
        }
        pTVar11 = (pointer)&parents.inner.
                            super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                            .stack.fixed._M_elems
                            [(long)parents.inner.
                                   super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                                   .
                                   super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                                   .
                                   super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                                   .replacep + -2].currp;
      }
      else {
        pTVar11 = parents.inner.
                  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                  .stack.flexible.
                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      ppEVar1 = pTVar11->currp;
      if ((pointer)parents.inner.
                   super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          parents.inner.
          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (parents.inner.
            super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::Task, N = 10]"
                       );
        }
        parents.inner.
        super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .replacep = (Expression **)
                    ((long)parents.inner.
                           super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                           .replacep + -1);
      }
      else {
        parents.inner.
        super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             parents.inner.
             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_1c8 = (undefined1  [8])ppEVar1;
      if (*ppEVar1 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::GetParents::Inner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>]"
                     );
      }
      (*pTVar11->func)((Inner *)auStack_1c8,ppEVar1);
    } while (((long)parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
             (long)parents.inner.
                   super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .replacep != 0);
  }
  pLVar5 = LazyLocalGraph::getLocations((LazyLocalGraph *)set[9].value);
  p_Var6 = (pLVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(pLVar5->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var14) {
    parents.inner.parentMap._M_h._M_single_bucket = (__node_base_ptr)(set + 10);
    do {
      local_40 = *(LocalSet **)(p_Var6 + 1);
      if (((*(LocalSet **)(p_Var6 + 1))->super_SpecificExpression<(wasm::Expression::Id)9>).
          super_Expression._id != LocalSetId) {
        local_40 = (LocalSet *)0x0;
      }
      if ((((local_40 != (LocalSet *)0x0) && (pEVar2 = local_40->value, pEVar2->_id == BinaryId)) &&
          (*(int *)(pEVar2 + 1) == 0)) &&
         ((*(char *)pEVar2[1].type.id == '\x0e' || (**(char **)(pEVar2 + 2) == '\x0e')))) {
        pSVar7 = LazyLocalGraph::getSetInfluences((LazyLocalGraph *)set[9].value,local_40);
        p_Var10 = &(pSVar7->_M_h)._M_before_begin;
        do {
          p_Var10 = p_Var10->_M_nxt;
          pLVar12 = (LocalSet *)0x1;
          if (p_Var10 == (__node_base *)0x0) break;
          _Var3._M_nxt = p_Var10[1]._M_nxt;
          pEVar2 = parents.inner.
                   super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .expressionStack.flexible.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage
                   [(ulong)_Var3._M_nxt % (ulong)parents.inner.parentMap._M_h._M_buckets];
          pEVar8 = (Expression *)0x0;
          if ((pEVar2 != (Expression *)0x0) &&
             (pEVar8 = pEVar2, pEVar13 = *(Expression **)pEVar2,
             (_Hash_node_base *)((*(Expression **)pEVar2)->type).id != _Var3._M_nxt)) {
            while (pEVar2 = *(Expression **)pEVar13, pEVar2 != (Expression *)0x0) {
              p_Var4 = (_Hash_node_base *)(pEVar2->type).id;
              pEVar8 = (Expression *)0x0;
              if (((ulong)p_Var4 % (ulong)parents.inner.parentMap._M_h._M_buckets !=
                   (ulong)_Var3._M_nxt % (ulong)parents.inner.parentMap._M_h._M_buckets) ||
                 (pEVar8 = pEVar13, pEVar13 = pEVar2, p_Var4 == _Var3._M_nxt)) goto LAB_009b9242;
            }
            pEVar8 = (Expression *)0x0;
          }
LAB_009b9242:
          if (pEVar8 == (Expression *)0x0) {
            lVar9 = 0;
          }
          else {
            lVar9 = *(long *)pEVar8;
          }
          if (lVar9 == 0) {
            __assert_fail("iter != inner.parentMap.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                          ,0x32,
                          "Expression *wasm::(anonymous namespace)::GetParents::getParent(LocalGet *) const"
                         );
          }
          if (*(byte **)(lVar9 + 0x10) == (byte *)0x0) {
            __assert_fail("parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                          ,0x187,"void wasm::OptimizeAddedConstants::findPropagatable()");
          }
          pLVar12 = (LocalSet *)0x0;
        } while ((**(byte **)(lVar9 + 0x10) & 0xfe) == 0xc);
        if (pLVar12 != (LocalSet *)0x0) {
          std::
          _Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
          ::_M_insert_unique<wasm::LocalSet*const&>
                    ((_Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
                      *)parents.inner.parentMap._M_h._M_single_bucket,&local_40);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var14);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .expressionStack.flexible.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (parents.inner.
      super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .expressionStack.fixed._M_elems[9] != (Expression *)0x0) {
    operator_delete(parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .expressionStack.fixed._M_elems[9],
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .expressionStack.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .expressionStack.fixed._M_elems[9]);
  }
  if (parents.inner.
      super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

void findPropagatable() {
    // Conservatively, only propagate if all uses can be removed of the
    // original. That is,
    //  x = a + 10
    //  f(x)
    //  g(x)
    // should be optimized to
    //  f(a, offset=10)
    //  g(a, offset=10)
    // but if x has other uses, then avoid doing so - we'll be doing that add
    // anyhow, so the load/store offset trick won't actually help.
    GetParents parents(getFunction()->body);
    for (auto& [location, _] : localGraph->getLocations()) {
      if (auto* set = location->dynCast<LocalSet>()) {
        if (auto* add = set->value->dynCast<Binary>()) {
          if (add->op == AddInt32) {
            if (add->left->is<Const>() || add->right->is<Const>()) {
              // Looks like this might be relevant, check all uses.
              bool canPropagate = true;
              for (auto* get : localGraph->getSetInfluences(set)) {
                auto* parent = parents.getParent(get);
                // if this is at the top level, it's the whole body - no set can
                // exist!
                assert(parent);
                if (!(parent->is<Load>() || parent->is<Store>())) {
                  canPropagate = false;
                  break;
                }
              }
              if (canPropagate) {
                propagatable.insert(set);
              }
            }
          }
        }
      }
    }
  }